

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O0

StatusOr<const_google::protobuf::Message_*> __thiscall
google::protobuf::json_internal::UnparseProto2Descriptor::GetMessage
          (UnparseProto2Descriptor *this,Field f)

{
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 extraout_RDX;
  StatusOr<const_google::protobuf::Message_*> SVar1;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  Status local_20;
  Field local_18;
  Field f_local;
  
  local_18 = f;
  f_local = (Field)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,"message fields cannot have defaults");
  absl::lts_20240722::InternalError(&local_20,local_30._M_len,local_30._M_str);
  absl::lts_20240722::StatusOr<const_google::protobuf::Message_*>::
  StatusOr<absl::lts_20240722::Status,_0>
            ((StatusOr<const_google::protobuf::Message_*> *)this,&local_20);
  absl::lts_20240722::Status::~Status(&local_20);
  SVar1.super_StatusOrData<const_google::protobuf::Message_*>.field_1.data_ = extraout_RDX.data_;
  SVar1.super_StatusOrData<const_google::protobuf::Message_*>.field_0 =
       (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)this;
  return (StatusOr<const_google::protobuf::Message_*>)
         SVar1.super_StatusOrData<const_google::protobuf::Message_*>;
}

Assistant:

static absl::StatusOr<const Msg*> GetMessage(Field f) {
    return absl::InternalError("message fields cannot have defaults");
  }